

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.upb.h
# Opt level: O0

upb_test_FakeMessageSet_Item *
upb_test_FakeMessageSet_add_item(upb_test_FakeMessageSet *msg,upb_Arena *arena)

{
  bool bVar1;
  upb_test_FakeMessageSet_Item *local_40;
  upb_test_FakeMessageSet_Item *sub;
  upb_Array *arr;
  upb_MiniTableField field;
  upb_Arena *arena_local;
  upb_test_FakeMessageSet *msg_local;
  
  stack0xffffffffffffffd4 = 0x800000001;
  field.number_dont_copy_me__upb_internal_use_only = 0xc10a0000;
  field._4_8_ = arena;
  _upb_MiniTable_StrongReference_dont_copy_me__upb_internal_use_only
            (&upb_0test__FakeMessageSet__Item_msg_init);
  sub = (upb_test_FakeMessageSet_Item *)
        upb_Message_GetOrCreateMutableArray
                  (&msg->base_dont_copy_me__upb_internal_use_only,
                   (upb_MiniTableField *)((long)&arr + 4),(upb_Arena *)field._4_8_);
  if (((upb_Array *)sub == (upb_Array *)0x0) ||
     (bVar1 = _upb_Array_ResizeUninitialized_dont_copy_me__upb_internal_use_only
                        ((upb_Array *)sub,
                         ((upb_Array *)sub)->size_dont_copy_me__upb_internal_use_only + 1,
                         (upb_Arena *)field._4_8_), !bVar1)) {
    return (upb_test_FakeMessageSet_Item *)0x0;
  }
  local_40 = (upb_test_FakeMessageSet_Item *)
             _upb_Message_New(&upb_0test__FakeMessageSet__Item_msg_init,(upb_Arena *)field._4_8_);
  if ((sub != (upb_test_FakeMessageSet_Item *)0x0) &&
     (local_40 != (upb_test_FakeMessageSet_Item *)0x0)) {
    _upb_Array_Set_dont_copy_me__upb_internal_use_only
              ((upb_Array *)sub,
               sub[1].base_dont_copy_me__upb_internal_use_only.field_0.internal_opaque - 1,&local_40
               ,8);
    return local_40;
  }
  return (upb_test_FakeMessageSet_Item *)0x0;
}

Assistant:

UPB_INLINE struct upb_test_FakeMessageSet_Item* upb_test_FakeMessageSet_add_item(upb_test_FakeMessageSet* msg, upb_Arena* arena) {
  upb_MiniTableField field = {1, 8, 0, 0, 10, (int)kUpb_FieldMode_Array | ((int)UPB_SIZE(kUpb_FieldRep_4Byte, kUpb_FieldRep_8Byte) << kUpb_FieldRep_Shift)};
  UPB_PRIVATE(_upb_MiniTable_StrongReference)(&upb_0test__FakeMessageSet__Item_msg_init);
  upb_Array* arr = upb_Message_GetOrCreateMutableArray(
      UPB_UPCAST(msg), &field, arena);
  if (!arr || !UPB_PRIVATE(_upb_Array_ResizeUninitialized)(
                  arr, arr->UPB_PRIVATE(size) + 1, arena)) {
    return NULL;
  }
  struct upb_test_FakeMessageSet_Item* sub = (struct upb_test_FakeMessageSet_Item*)_upb_Message_New(&upb_0test__FakeMessageSet__Item_msg_init, arena);
  if (!arr || !sub) return NULL;
  UPB_PRIVATE(_upb_Array_Set)
  (arr, arr->UPB_PRIVATE(size) - 1, &sub, sizeof(sub));
  return sub;
}